

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall gl3cts::TransformFeedback::DrawXFBInstanced::prepareObjects(DrawXFBInstanced *this)

{
  int iVar1;
  GLuint GVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  undefined4 *puVar7;
  GLuint uniform_index;
  Functions *gl;
  DrawXFBInstanced *this_local;
  Functions *gl_00;
  
  pRVar4 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  pTVar5 = deqp::Context::getTestContext(this->m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  GVar2 = Utilities::buildProgram
                    (gl_00,pTVar6,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,s_vertex_shader_generate
                     ,s_fragment_shader,&s_xfb_varying,1,0x8c8c,false,(GLint *)0x0);
  this->m_program_id_generate = GVar2;
  if (this->m_program_id_generate == 0) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  pTVar5 = deqp::Context::getTestContext(this->m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  GVar2 = Utilities::buildProgram
                    (gl_00,pTVar6,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,s_vertex_shader_draw,
                     s_fragment_shader,(GLchar **)0x0,0,0x8c8c,false,(GLint *)0x0);
  this->m_program_id_draw = GVar2;
  if (this->m_program_id_draw == 0) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  (*gl_00->genTransformFeedbacks)(1,&this->m_xfb_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenTransformFeedbacks call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1704);
  (*gl_00->bindTransformFeedback)(0x8e22,this->m_xfb_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindTransformFeedbacks call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1707);
  (*gl_00->genVertexArrays)(1,&this->m_vao_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x170b);
  (*gl_00->bindVertexArray)(this->m_vao_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x170e);
  (*gl_00->genBuffers)(1,&this->m_bo_id_xfb);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1712);
  (*gl_00->bindBuffer)(0x8c8e,this->m_bo_id_xfb);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1715);
  (*gl_00->bufferData)(0x8c8e,0x40,(void *)0x0,0x88ea);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1718);
  (*gl_00->bindBufferBase)(0x8c8e,0,this->m_bo_id_xfb);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindBufferRange call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x171b);
  (*gl_00->genBuffers)(1,&this->m_bo_id_uniform);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x171f);
  (*gl_00->bindBuffer)(0x8a11,this->m_bo_id_uniform);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1722);
  (*gl_00->bufferData)(0x8a11,0x100,s_bo_uniform_data,0x88ea);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1725);
  (*gl_00->bindBufferBase)(0x8a11,0,this->m_bo_id_uniform);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindBufferRange call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1728);
  GVar2 = (*gl_00->getUniformBlockIndex)(this->m_program_id_draw,s_uniform);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGetUniformBlockIndex call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x172b);
  if (GVar2 == 0xffffffff) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  (*gl_00->uniformBlockBinding)(this->m_program_id_draw,GVar2,0);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glUniformBlockBinding call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1733);
  (*gl_00->clearColor)(0.0,0.0,0.0,1.0);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glClearColor call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1737);
  (*gl_00->genFramebuffers)(1,&this->m_fbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenFramebuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x173a);
  (*gl_00->genRenderbuffers)(1,&this->m_rbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenRenderbuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x173d);
  (*gl_00->bindFramebuffer)(0x8d40,this->m_fbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1740);
  (*gl_00->bindRenderbuffer)(0x8d41,this->m_rbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindRenderbuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1743);
  (*gl_00->renderbufferStorage)(0x8d41,0x8229,4,4);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glRenderbufferStorage call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1746);
  (*gl_00->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,this->m_rbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glFramebufferRenderbuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1749);
  GVar3 = (*gl_00->checkFramebufferStatus)(0x8d40);
  if (GVar3 != 0x8cd5) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  (*gl_00->viewport)(0,0,4,4);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glViewport call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1751);
  return;
}

Assistant:

void gl3cts::TransformFeedback::DrawXFBInstanced::prepareObjects()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare programs. */
	m_program_id_generate = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, s_vertex_shader_generate, s_fragment_shader,
		&s_xfb_varying, 1, GL_INTERLEAVED_ATTRIBS);

	if (0 == m_program_id_generate)
	{
		throw 0;
	}

	m_program_id_draw = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, s_vertex_shader_draw, s_fragment_shader, NULL, 0,
		GL_INTERLEAVED_ATTRIBS);

	if (0 == m_program_id_draw)
	{
		throw 0;
	}

	/* Prepare transform feedbacks. */
	gl.genTransformFeedbacks(1, &m_xfb_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks call failed.");

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfb_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedbacks call failed.");

	/* Create empty Vertex Array Object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Prepare xfb buffer object. */
	gl.genBuffers(1, &m_bo_id_xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, s_bo_xfb_size, NULL, GL_DYNAMIC_COPY); /* allocation */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_bo_id_xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange call failed.");

	/* Prepare uniform buffer object. */
	gl.genBuffers(1, &m_bo_id_uniform);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_UNIFORM_BUFFER, m_bo_id_uniform);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.bufferData(GL_UNIFORM_BUFFER, s_bo_uniform_size, s_bo_uniform_data, GL_DYNAMIC_COPY); /* allocation */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	gl.bindBufferBase(GL_UNIFORM_BUFFER, 0, m_bo_id_uniform);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange call failed.");

	glw::GLuint uniform_index = gl.getUniformBlockIndex(m_program_id_draw, s_uniform);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformBlockIndex call failed.");

	if (GL_INVALID_INDEX == uniform_index)
	{
		throw 0;
	}

	gl.uniformBlockBinding(m_program_id_draw, uniform_index, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformBlockBinding call failed.");

	/* Prepare framebuffer. */
	gl.clearColor(0.f, 0.f, 0.f, 1.f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor call failed.");

	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers call failed.");

	gl.genRenderbuffers(1, &m_rbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer call failed.");

	gl.renderbufferStorage(GL_RENDERBUFFER, GL_R8, s_view_size, s_view_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage call failed.");

	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer call failed.");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	gl.viewport(0, 0, s_view_size, s_view_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");
}